

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
helics::helicsGetVector
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,helics *this,
          string_view val)

{
  string_view val_00;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  val_00._M_str = (char *)val._M_len;
  val_00._M_len = (size_t)this;
  helicsGetVector(val_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> helicsGetVector(std::string_view val)
{
    std::vector<double> vectorVal;
    helicsGetVector(val, vectorVal);
    return vectorVal;
}